

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O2

void __thiscall
pbrt::syntactic::Attributes::insertNamedMaterial
          (Attributes *this,string *name,shared_ptr<pbrt::syntactic::Material> *material)

{
  __shared_ptr<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2> *this_00;
  
  this_00 = &std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Material>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Material>_>_>_>
             ::operator[](&this->namedMaterial,name)->
             super___shared_ptr<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2>::operator=
            (this_00,&material->
                      super___shared_ptr<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2>);
  modified(this);
  return;
}

Assistant:

void insertNamedMaterial(std::string name,
                               std::shared_ptr<Material> material) {
        namedMaterial[name] = material;
        modified();
      }